

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_sequence_adapter.hpp
# Opt level: O0

bool asio::detail::
     buffer_sequence_adapter<asio::const_buffer,asio::detail::prepared_buffers<asio::const_buffer,64ul>>
     ::all_empty<asio::const_buffer_const*>(const_buffer *begin,const_buffer *end)

{
  size_t sVar1;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  size_t i;
  const_buffer *iter;
  const_buffer local_38;
  ulong local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  
  local_28 = 0;
  local_20 = in_RDI;
  local_18 = in_RSI;
  while( true ) {
    if (local_20 == local_18 || 0x3f < local_28) {
      return true;
    }
    local_38.data_ = (void *)*local_20;
    local_38.size_ = local_20[1];
    sVar1 = const_buffer::size(&local_38);
    if (sVar1 != 0) break;
    local_20 = local_20 + 2;
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

static bool all_empty(Iterator begin, Iterator end)
  {
    Iterator iter = begin;
    std::size_t i = 0;
    for (; iter != end && i < max_buffers; ++iter, ++i)
      if (Buffer(*iter).size() > 0)
        return false;
    return true;
  }